

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::_::Deferred<kj::Function<void()>>>
          (Promise<void> *this,Deferred<kj::Function<void_()>_> *attachments)

{
  PromiseNode *pPVar1;
  char *in_RDX;
  Deferred<kj::Function<void_()>_> local_38;
  PromiseNode *local_20;
  
  local_38.maybeFunc.ptr.isSet = (bool)*in_RDX;
  if (local_38.maybeFunc.ptr.isSet == true) {
    local_38.maybeFunc.ptr.field_1.value.impl.disposer = (Disposer *)*(undefined8 *)(in_RDX + 8);
    local_38.maybeFunc.ptr.field_1.value.impl.ptr = (Iface *)*(undefined8 *)(in_RDX + 0x10);
    in_RDX[0x10] = '\0';
    in_RDX[0x11] = '\0';
    in_RDX[0x12] = '\0';
    in_RDX[0x13] = '\0';
    in_RDX[0x14] = '\0';
    in_RDX[0x15] = '\0';
    in_RDX[0x16] = '\0';
    in_RDX[0x17] = '\0';
    *in_RDX = '\0';
  }
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void()>>>,kj::_::PromiseDisposer,kj::_::Deferred<kj::Function<void()>>>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)attachments,&local_38);
  pPVar1 = local_20;
  local_20 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar1;
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred(&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}